

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemeBool::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeBool *this)

{
  char *local_48;
  allocator local_19;
  SchemeBool *local_18;
  SchemeBool *this_local;
  
  if ((this->value & 1U) == 0) {
    local_48 = "#f";
  }
  else {
    local_48 = "#t";
  }
  local_18 = this;
  this_local = (SchemeBool *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_48,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeBool::external_repr() const
{
    return value ? "#t" : "#f";
}